

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

void __thiscall
rr::MultiSampleLineRasterizer::rasterize
          (MultiSampleLineRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  float fVar1;
  float fVar2;
  int iVar3;
  uint in_EAX;
  Vec4 *pVVar4;
  long lVar5;
  long lVar6;
  float *depthValues_00;
  long lVar7;
  int numPacketsRasterized2;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  TriangleRasterizer::rasterize
            (&this->m_triangleRasterizer0,fragmentPackets,depthValues,maxFragmentPackets,
             numPacketsRasterized);
  iVar3 = *numPacketsRasterized;
  lVar7 = (long)iVar3;
  if (0 < lVar7) {
    pVVar4 = fragmentPackets->barycentric + 2;
    lVar5 = 0;
    do {
      lVar6 = -4;
      do {
        fVar1 = *(float *)((long)(pVVar4 + 1) + lVar6 * 4);
        *(undefined4 *)((long)(pVVar4 + 1) + lVar6 * 4) = 0;
        pVVar4->m_data[lVar6] = fVar1 + pVVar4->m_data[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0);
      lVar5 = lVar5 + 1;
      pVVar4 = pVVar4 + 4;
    } while (lVar5 != lVar7);
  }
  if (maxFragmentPackets != iVar3) {
    depthValues_00 = depthValues + this->m_numSamples * iVar3 * 4;
    if (depthValues == (float *)0x0) {
      depthValues_00 = (float *)0x0;
    }
    uStack_38 = (ulong)(uint)uStack_38;
    TriangleRasterizer::rasterize
              (&this->m_triangleRasterizer1,fragmentPackets + lVar7,depthValues_00,
               maxFragmentPackets - iVar3,(int *)((long)&uStack_38 + 4));
    *numPacketsRasterized = *numPacketsRasterized + uStack_38._4_4_;
    if (0 < (long)uStack_38._4_4_) {
      pVVar4 = fragmentPackets[lVar7].barycentric + 2;
      lVar7 = 0;
      do {
        lVar5 = -4;
        do {
          fVar1 = pVVar4[-1].m_data[lVar5];
          fVar2 = *(float *)((long)(pVVar4 + 1) + lVar5 * 4);
          *(undefined4 *)((long)(pVVar4 + 1) + lVar5 * 4) = 0;
          pVVar4[-1].m_data[lVar5] = fVar2 + pVVar4->m_data[lVar5];
          pVVar4->m_data[lVar5] = fVar1;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0);
        lVar7 = lVar7 + 1;
        pVVar4 = pVVar4 + 4;
      } while (lVar7 != uStack_38._4_4_);
    }
  }
  return;
}

Assistant:

void MultiSampleLineRasterizer::rasterize (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	m_triangleRasterizer0.rasterize(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);

	// Remove 3rd barycentric value and rebalance. Lines do not have non-zero barycentric at index 2
	for (int packNdx = 0; packNdx < numPacketsRasterized; ++packNdx)
	for (int fragNdx = 0; fragNdx < 4; fragNdx++)
	{
		float removedValue = fragmentPackets[packNdx].barycentric[2][fragNdx];
		fragmentPackets[packNdx].barycentric[2][fragNdx] = 0.0f;
		fragmentPackets[packNdx].barycentric[1][fragNdx] += removedValue;
	}

	// rasterizer 0 filled the whole buffer?
	if (numPacketsRasterized == maxFragmentPackets)
		return;

	{
		FragmentPacket* const nextFragmentPackets	= fragmentPackets + numPacketsRasterized;
		float* nextDepthValues						= (depthValues) ? (depthValues+4*numPacketsRasterized*m_numSamples) : (DE_NULL);
		int numPacketsRasterized2					= 0;

		m_triangleRasterizer1.rasterize(nextFragmentPackets, nextDepthValues, maxFragmentPackets - numPacketsRasterized, numPacketsRasterized2);

		numPacketsRasterized += numPacketsRasterized2;

		// Fix swapped barycentrics in the second triangle
		for (int packNdx = 0; packNdx < numPacketsRasterized2; ++packNdx)
		for (int fragNdx = 0; fragNdx < 4; fragNdx++)
		{
			float removedValue = nextFragmentPackets[packNdx].barycentric[2][fragNdx];
			nextFragmentPackets[packNdx].barycentric[2][fragNdx] = 0.0f;
			nextFragmentPackets[packNdx].barycentric[1][fragNdx] += removedValue;

			// edge has reversed direction
			std::swap(nextFragmentPackets[packNdx].barycentric[0][fragNdx], nextFragmentPackets[packNdx].barycentric[1][fragNdx]);
		}
	}
}